

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O1

void __thiscall QHostInfoCache::QHostInfoCache(QHostInfoCache *this)

{
  undefined8 *puVar1;
  size_t sVar2;
  
  this->max_age = 0x3c;
  (this->enabled)._M_base._M_i = true;
  (this->cache).chain.prev = &(this->cache).chain;
  (this->cache).chain.next = &(this->cache).chain;
  (this->cache).d.ref.atomic._q_value.super___atomic_base<int>._M_i = 1;
  (this->cache).d.size = 0;
  (this->cache).d.numBuckets = 0;
  (this->cache).d.seed = 0;
  (this->cache).d.spans = (Span *)0x0;
  (this->cache).d.numBuckets = 0x80;
  puVar1 = (undefined8 *)operator_new__(0x98);
  *puVar1 = 1;
  puVar1[0x11] = 0;
  *(undefined2 *)(puVar1 + 0x12) = 0;
  *(undefined4 *)(puVar1 + 1) = 0xffffffff;
  *(undefined4 *)((long)puVar1 + 0xc) = 0xffffffff;
  *(undefined4 *)(puVar1 + 2) = 0xffffffff;
  *(undefined4 *)((long)puVar1 + 0x14) = 0xffffffff;
  *(undefined4 *)(puVar1 + 3) = 0xffffffff;
  *(undefined4 *)((long)puVar1 + 0x1c) = 0xffffffff;
  *(undefined4 *)(puVar1 + 4) = 0xffffffff;
  *(undefined4 *)((long)puVar1 + 0x24) = 0xffffffff;
  *(undefined4 *)(puVar1 + 5) = 0xffffffff;
  *(undefined4 *)((long)puVar1 + 0x2c) = 0xffffffff;
  *(undefined4 *)(puVar1 + 6) = 0xffffffff;
  *(undefined4 *)((long)puVar1 + 0x34) = 0xffffffff;
  *(undefined4 *)(puVar1 + 7) = 0xffffffff;
  *(undefined4 *)((long)puVar1 + 0x3c) = 0xffffffff;
  *(undefined4 *)(puVar1 + 8) = 0xffffffff;
  *(undefined4 *)((long)puVar1 + 0x44) = 0xffffffff;
  *(undefined4 *)(puVar1 + 9) = 0xffffffff;
  *(undefined4 *)((long)puVar1 + 0x4c) = 0xffffffff;
  *(undefined4 *)(puVar1 + 10) = 0xffffffff;
  *(undefined4 *)((long)puVar1 + 0x54) = 0xffffffff;
  *(undefined4 *)(puVar1 + 0xb) = 0xffffffff;
  *(undefined4 *)((long)puVar1 + 0x5c) = 0xffffffff;
  *(undefined4 *)(puVar1 + 0xc) = 0xffffffff;
  *(undefined4 *)((long)puVar1 + 100) = 0xffffffff;
  *(undefined4 *)(puVar1 + 0xd) = 0xffffffff;
  *(undefined4 *)((long)puVar1 + 0x6c) = 0xffffffff;
  *(undefined4 *)(puVar1 + 0xe) = 0xffffffff;
  *(undefined4 *)((long)puVar1 + 0x74) = 0xffffffff;
  *(undefined4 *)(puVar1 + 0xf) = 0xffffffff;
  *(undefined4 *)((long)puVar1 + 0x7c) = 0xffffffff;
  *(undefined4 *)(puVar1 + 0x10) = 0xffffffff;
  *(undefined4 *)((long)puVar1 + 0x84) = 0xffffffff;
  (this->cache).d.spans = (Span *)(puVar1 + 1);
  sVar2 = QHashSeed::globalSeed();
  (this->cache).d.seed = sVar2;
  (this->cache).mx = 0x80;
  *(undefined1 (*) [16])&(this->cache).total = (undefined1  [16])0x0;
  return;
}

Assistant:

QHostInfoCache::QHostInfoCache() : max_age(60), enabled(true), cache(128)
{
#ifdef QT_QHOSTINFO_CACHE_DISABLED_BY_DEFAULT
    enabled.store(false, std::memory_order_relaxed);
#endif
}